

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

shared_ptr<mocker::ast::Expression> __thiscall
mocker::Parser::primaryExpr(Parser *this,TokIter *iter,TokIter end)

{
  Position beg;
  Position beg_00;
  Position end_00;
  Position end_01;
  TokIter TVar1;
  TokenID TVar2;
  mapped_type *pmVar3;
  CompileError *pCVar4;
  TokIter in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  shared_ptr<mocker::ast::IdentifierExpr> sVar6;
  shared_ptr<mocker::ast::LiteralExpr> sVar7;
  shared_ptr<mocker::ast::NewExpr> sVar8;
  shared_ptr<mocker::ast::Expression> sVar9;
  Position beg_01;
  vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
  args;
  size_t local_80;
  undefined1 local_78 [16];
  shared_ptr<mocker::ast::Identifier> ident;
  TokIter local_58;
  TokIter TStack_50;
  shared_ptr<mocker::ast::Identifier> local_48;
  element_type *local_38;
  
  sVar6 = identifierExpr((Parser *)local_78,iter,end);
  _Var5 = sVar6.super___shared_ptr<mocker::ast::IdentifierExpr,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if ((Token *)local_78._0_8_ == (Token *)0x0) {
    if ((Token *)local_78._8_8_ != (Token *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
    sVar7 = literalExpr((Parser *)&args,iter,end);
    _Var5 = sVar7.super___shared_ptr<mocker::ast::LiteralExpr,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if (args.
        super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      if (args.
          super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   args.
                   super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      sVar8 = newExpr((Parser *)&args,iter,end);
      _Var5 = sVar8.super___shared_ptr<mocker::ast::NewExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
      if (args.
          super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        if (args.
            super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     args.
                     super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        Token::position(*end._M_current);
        _Var5._M_pi = extraout_RDX_00;
        if (*end._M_current != in_RCX._M_current) {
          beg_00.col = (size_t)args.
                               super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
          beg_00.line = (size_t)args.
                                super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
          beg.col = (size_t)args.
                            super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
          beg.line = (size_t)args.
                             super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          TVar2 = Token::tokenID(*end._M_current);
          _Var5._M_pi = extraout_RDX_01;
          if (TVar2 == LeftParen) {
            *(long *)end._M_current = *(long *)end._M_current + 0x38;
            args.
            super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)logicalOrExpr;
            args.
            super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_78._0_8_ = (Token *)0x2f;
            args.
            super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)iter;
            auxBinaryExpr<std::_Bind<std::shared_ptr<mocker::ast::Expression>(mocker::Parser::*(mocker::Parser*,std::_Placeholder<1>,std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>&,__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>)>>
                      (this,iter,end,
                       (_Bind<std::shared_ptr<mocker::ast::Expression>_(mocker::Parser::*(mocker::Parser_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>_&,___gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>)>
                        *)in_RCX._M_current,
                       (pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> *)&args);
            if ((this->tokBeg)._M_current == (Token *)0x0) {
              pCVar4 = (CompileError *)__cxa_allocate_exception(0x48);
              Token::position(*end._M_current);
              end_01.col = local_80;
              end_01.line = (size_t)args.
                                    super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
              CompileError::CompileError(pCVar4,beg_00,end_01);
              *(undefined ***)pCVar4 = &PTR__CompileError_001eba98;
              __cxa_throw(pCVar4,&SyntaxError::typeinfo,CompileError::~CompileError);
            }
            if (*end._M_current != in_RCX._M_current) {
              TVar2 = Token::tokenID(*end._M_current);
              if (TVar2 == RightParen) {
                *(long *)end._M_current = *(long *)end._M_current + 0x38;
                _Var5._M_pi = extraout_RDX_02;
                goto LAB_0017bdd4;
              }
            }
            pCVar4 = (CompileError *)__cxa_allocate_exception(0x48);
            Token::position(*end._M_current);
            end_00.col = local_80;
            end_00.line = (size_t)args.
                                  super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
            CompileError::CompileError(pCVar4,beg,end_00);
            *(undefined ***)pCVar4 = &PTR__CompileError_001eba98;
            __cxa_throw(pCVar4,&SyntaxError::typeinfo,CompileError::~CompileError);
          }
        }
        (this->tokBeg)._M_current = (Token *)0x0;
        (this->tokEnd)._M_current = (Token *)0x0;
        goto LAB_0017bdd4;
      }
    }
    (this->tokBeg)._M_current =
         (Token *)args.
                  super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_78._8_8_ =
         args.
         super__Vector_base<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    if (*end._M_current != in_RCX._M_current) {
      TVar2 = Token::tokenID(*end._M_current);
      _Var5._M_pi = extraout_RDX;
      if (TVar2 == LeftParen) {
        *(long *)end._M_current = *(long *)end._M_current + 0x38;
        ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)((Position *)(local_78._0_8_ + 0x18))->line;
        ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((Position *)(local_78._0_8_ + 0x18))->col;
        if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        exprList(&args,(Parser *)iter,(TokIter *)end._M_current,in_RCX);
        if (*end._M_current != in_RCX._M_current) {
          TVar2 = Token::tokenID(*end._M_current);
          if (TVar2 == RightParen) {
            *(long *)end._M_current = *(long *)end._M_current + 0x38;
            local_38 = ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
            pmVar3 = std::__detail::
                     _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)iter[2]._M_current,(key_type *)&local_38);
            local_48.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)0x0;
            local_48.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            beg_01.col = (pmVar3->first).line;
            beg_01.line = (size_t)iter;
            makeNode<mocker::ast::FuncCallExpr,std::shared_ptr<mocker::ast::Expression>,std::shared_ptr<mocker::ast::Identifier>,std::vector<std::shared_ptr<mocker::ast::Expression>,std::allocator<std::shared_ptr<mocker::ast::Expression>>>>
                      ((Parser *)&stack0xffffffffffffffa8,beg_01,*(Position *)&(pmVar3->first).col,
                       (shared_ptr<mocker::ast::Expression> *)(pmVar3->second).col,&local_48,
                       (vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
                        *)&ident);
            TVar1._M_current = TStack_50._M_current;
            TStack_50._M_current = (Token *)0x0;
            (this->tokBeg)._M_current = local_58._M_current;
            (this->tokEnd)._M_current = TVar1._M_current;
            local_58._M_current = (Token *)0x0;
            if (local_48.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_48.
                         super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            std::
            vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
            ::~vector(&args);
            _Var5._M_pi = extraout_RDX_03;
            if (ident.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (ident.
                         super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              _Var5._M_pi = extraout_RDX_04;
            }
            if ((Token *)local_78._8_8_ != (Token *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
              _Var5._M_pi = extraout_RDX_05;
            }
            goto LAB_0017bdd4;
          }
        }
        __assert_fail("id(iter) == TokenID::RightParen",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/parser.cpp"
                      ,0xb6,
                      "std::shared_ptr<ast::Expression> mocker::Parser::primaryExpr(TokIter &, TokIter)"
                     );
      }
    }
    (this->tokBeg)._M_current = (Token *)local_78._0_8_;
  }
  (this->tokEnd)._M_current = (Token *)local_78._8_8_;
LAB_0017bdd4:
  sVar9.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar9.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::Expression>)
         sVar9.super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::Expression> Parser::primaryExpr(TokIter &iter,
                                                     TokIter end) {
  auto id = GetTokenID(end);
  if (auto identExpr = identifierExpr(iter, end)) {
    if (id(iter) != TokenID::LeftParen)
      return identExpr;
    ++iter;
    auto ident = identExpr->identifier;
    auto args = exprList(iter, end);
    assert(id(iter) == TokenID::RightParen);
    ++iter;
    return makeNode<ast::FuncCallExpr>(
        pos[ident->getID()], std::shared_ptr<ast::Expression>(nullptr),
        std::move(ident), std::move(args));
  }
  if (auto res = literalExpr(iter, end))
    return res;
  if (auto res = newExpr(iter, end))
    return res;

  auto begPos = iter->position().first;
  if (id(iter) != TokenID::LeftParen)
    return nullptr;
  ++iter;
  auto expr = expression(iter, end);
  if (!expr)
    throw SyntaxError(begPos, iter->position().second);
  if (id(iter) != TokenID::RightParen)
    throw SyntaxError(begPos, iter->position().second);
  ++iter;
  return expr;
}